

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_mutex.cpp
# Opt level: O0

Mutex * __thiscall MutexPool::get(MutexPool *this,void *address)

{
  Mutex *this_00;
  int iVar1;
  Mutex *local_38;
  Mutex *m;
  size_t index;
  Lock lock;
  void *address_local;
  MutexPool *this_local;
  
  lock._8_8_ = address;
  Lock::Lock((Lock *)&index,&this->mutex_,true);
  iVar1 = (int)(((ulong)lock._8_8_ >> 4) % this->size_);
  local_38 = this->mutexes_[iVar1];
  if (local_38 == (Mutex *)0x0) {
    this_00 = (Mutex *)operator_new(0x30);
    Mutex::Mutex(this_00);
    this->mutexes_[iVar1] = this_00;
    local_38 = this->mutexes_[iVar1];
  }
  Lock::~Lock((Lock *)&index);
  return local_38;
}

Assistant:

Mutex &MutexPool::get(const void *address)
{
	Lock lock(mutex_);

	size_t index = int(((size_t)(void *)(address) >> (sizeof(address) >> 1)) % size_);

#if MUTEX_POOL_CHECK_FOR_DEADLOCKS
	index = 0;
#endif

	Mutex *m = mutexes_[index];

	if (!m) {
		mutexes_[index] = new Mutex;
		m = mutexes_[index];
	}

	return *m;
}